

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

void __thiscall
JsUtil::
List<Wasm::CustomSection,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
Reset(List<Wasm::CustomSection,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      *this)

{
  long *plVar1;
  long extraout_RDX;
  code *local_40;
  FreeFuncType freeFunc;
  List<Wasm::CustomSection,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_local;
  
  if ((this->super_ReadOnlyList<Wasm::CustomSection,_Memory::ArenaAllocator,_DefaultComparer>).
      buffer != (Type)0x0) {
    local_40 = (code *)Memory::ListTypeAllocatorFunc<Memory::ArenaAllocator,_false>::GetFreeFunc();
    plVar1 = (long *)((long)&(((this->
                               super_ReadOnlyList<Wasm::CustomSection,_Memory::ArenaAllocator,_DefaultComparer>
                               ).alloc)->
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             ).super_Allocator.outOfMemoryFunc + extraout_RDX);
    if (((ulong)local_40 & 1) != 0) {
      local_40 = *(code **)(local_40 + *plVar1 + -1);
    }
    (*local_40)(plVar1,(this->
                       super_ReadOnlyList<Wasm::CustomSection,_Memory::ArenaAllocator,_DefaultComparer>
                       ).buffer,(long)this->length << 5);
    (this->super_ReadOnlyList<Wasm::CustomSection,_Memory::ArenaAllocator,_DefaultComparer>).buffer
         = (Type)0x0;
    (this->super_ReadOnlyList<Wasm::CustomSection,_Memory::ArenaAllocator,_DefaultComparer>).count =
         0;
    this->length = 0;
  }
  return;
}

Assistant:

void Reset()
        {
            if (this->buffer != nullptr)
            {
                auto freeFunc = AllocatorInfo::GetFreeFunc();
                AllocatorFree(this->alloc, freeFunc, this->buffer, sizeof(T) * length); // TODO: Better version of DeleteArray?

                this->buffer = nullptr;
                this->count = 0;
                length = 0;
            }
        }